

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::build_extended_vector_type
          (CompilerMSL *this,uint32_t type_id,uint32_t components,BaseType basetype)

{
  bool bVar1;
  TypedID<(spirv_cross::Types)1> local_4c;
  TypedID<(spirv_cross::Types)0> local_48;
  uint32_t local_44;
  TypedID<(spirv_cross::Types)1> local_40;
  uint32_t ptr_type_id;
  TypedID<(spirv_cross::Types)1> local_38;
  uint32_t array_type_id;
  SPIRType *local_30;
  SPIRType *type;
  SPIRType *old_type;
  uint32_t new_type_id;
  BaseType basetype_local;
  uint32_t components_local;
  uint32_t type_id_local;
  CompilerMSL *this_local;
  
  old_type._4_4_ = basetype;
  new_type_id = components;
  basetype_local = type_id;
  _components_local = this;
  old_type._0_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,basetype_local);
  local_30 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                       ((Compiler *)this,(uint32_t)old_type,type);
  local_30->vecsize = new_type_id;
  if (old_type._4_4_ != Unknown) {
    *(BaseType *)&(local_30->super_IVariant).field_0xc = old_type._4_4_;
  }
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)&array_type_id,(uint32_t)old_type);
  (local_30->super_IVariant).self.id = array_type_id;
  TypedID<(spirv_cross::Types)1>::TypedID(&local_38,basetype_local);
  (local_30->parent_type).id = local_38.id;
  SmallVector<unsigned_int,_8UL>::clear(&local_30->array);
  SmallVector<bool,_8UL>::clear(&local_30->array_size_literal);
  local_30->pointer = false;
  bVar1 = Compiler::is_array((Compiler *)this,type);
  if (bVar1) {
    ptr_type_id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    local_30 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                         ((Compiler *)this,ptr_type_id,local_30);
    TypedID<(spirv_cross::Types)1>::TypedID(&local_40,(uint32_t)old_type);
    (local_30->parent_type).id = local_40.id;
    SmallVector<unsigned_int,_8UL>::operator=(&local_30->array,&type->array);
    SmallVector<bool,_8UL>::operator=(&local_30->array_size_literal,&type->array_size_literal);
    old_type._0_4_ = ptr_type_id;
  }
  if ((type->pointer & 1U) != 0) {
    local_44 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    local_30 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                         ((Compiler *)this,local_44,local_30);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_48,(uint32_t)old_type);
    (local_30->super_IVariant).self.id = local_48.id;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_4c,(uint32_t)old_type);
    (local_30->parent_type).id = local_4c.id;
    local_30->storage = type->storage;
    local_30->pointer = true;
    old_type._0_4_ = local_44;
  }
  return (uint32_t)old_type;
}

Assistant:

uint32_t CompilerMSL::build_extended_vector_type(uint32_t type_id, uint32_t components, SPIRType::BaseType basetype)
{
	uint32_t new_type_id = ir.increase_bound_by(1);
	auto &old_type = get<SPIRType>(type_id);
	auto *type = &set<SPIRType>(new_type_id, old_type);
	type->vecsize = components;
	if (basetype != SPIRType::Unknown)
		type->basetype = basetype;
	type->self = new_type_id;
	type->parent_type = type_id;
	type->array.clear();
	type->array_size_literal.clear();
	type->pointer = false;

	if (is_array(old_type))
	{
		uint32_t array_type_id = ir.increase_bound_by(1);
		type = &set<SPIRType>(array_type_id, *type);
		type->parent_type = new_type_id;
		type->array = old_type.array;
		type->array_size_literal = old_type.array_size_literal;
		new_type_id = array_type_id;
	}

	if (old_type.pointer)
	{
		uint32_t ptr_type_id = ir.increase_bound_by(1);
		type = &set<SPIRType>(ptr_type_id, *type);
		type->self = new_type_id;
		type->parent_type = new_type_id;
		type->storage = old_type.storage;
		type->pointer = true;
		new_type_id = ptr_type_id;
	}

	return new_type_id;
}